

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restclient.cpp
# Opt level: O0

void __thiscall YdiskRestClient::saveFromUrl(YdiskRestClient *this,string *urlFrom,string *pathTo)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  SSLClient *path;
  Headers *headers;
  element_type *peVar1;
  element_type *peVar2;
  undefined1 local_108 [8];
  shared_ptr<httplib::Response> r;
  string empty_body;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  allocator local_41;
  string local_40 [8];
  string url;
  string *pathTo_local;
  string *urlFrom_local;
  YdiskRestClient *this_local;
  
  url.field_2._8_8_ = pathTo;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"/v1/disk/resources/upload?url=",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  url_encode(&local_b8,this,urlFrom);
  std::operator+(&local_98,&local_b8,"&path=");
  url_encode((string *)((long)&empty_body.field_2 + 8),this,pathTo);
  std::operator+(&local_78,&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&empty_body.field_2 + 8));
  std::__cxx11::string::operator+=(local_40,(string *)&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)(empty_body.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  this_00 = &r.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::__cxx11::string::string((string *)this_00);
  path = this->http_client;
  headers = (Headers *)std::__cxx11::string::c_str();
  httplib::Client::Post
            ((Client *)local_108,(char *)path,headers,(string *)&this->headers,(char *)this_00);
  peVar1 = std::__shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2> *)local_108);
  if (peVar1 != (element_type *)0x0) {
    peVar2 = std::__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_108);
    if (peVar2->status == 0xca) {
      peVar2 = std::__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_108);
      wait_success_operation(this,&peVar2->body);
      goto LAB_0021f51d;
    }
  }
  peVar1 = std::__shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2> *)local_108);
  throw_response_error(this,peVar1);
LAB_0021f51d:
  std::shared_ptr<httplib::Response>::~shared_ptr((shared_ptr<httplib::Response> *)local_108);
  std::__cxx11::string::~string
            ((string *)
             &r.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void YdiskRestClient::saveFromUrl(std::string urlFrom, std::string pathTo)
{
    std::string url("/v1/disk/resources/upload?url=");
    url += url_encode(urlFrom) + "&path=" + url_encode(pathTo);
    std::string empty_body;
    auto r = http_client->Post(url.c_str(), headers, empty_body, "text/plain");

    if(r.get() && r->status==202){
        wait_success_operation(r->body);
        return;
    } else {
        throw_response_error(r.get());
    }
}